

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O1

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectMesh(CXMeshFileLoader *this,SXMesh *mesh)

{
  uint uVar1;
  array<unsigned_int> *this_00;
  array<irr::core::vector2d<float>_> *this_01;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer puVar4;
  double dVar5;
  ushort uVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  bool bVar9;
  u32 uVar10;
  u32 uVar11;
  int iVar12;
  u32 uVar13;
  u32 uVar14;
  float fVar15;
  undefined4 extraout_var;
  vector2d<float> *pvVar16;
  undefined7 uVar19;
  void *pvVar17;
  pointer pSVar18;
  ulong uVar20;
  u32 f;
  ulong uVar21;
  char *this_02;
  byte bVar22;
  long lVar23;
  byte bVar24;
  ushort uVar25;
  uint uVar26;
  SXMesh *pSVar27;
  array<irr::video::S3DVertex> *this_03;
  vector2d<float> *element;
  short sVar28;
  array<unsigned_short> *this_04;
  void *pvVar29;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar30;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar31;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  stringc objectName;
  array<unsigned_int> polygonfaces;
  stringc name;
  short local_110;
  short local_100;
  ulong local_f0;
  string<char> local_e8;
  long local_c8;
  SXMesh *local_c0;
  long local_b8;
  CXMeshFileLoader *local_b0;
  string<char> local_a8;
  string<char> local_88;
  undefined8 local_60;
  undefined8 local_58;
  stringc local_50;
  
  local_50.str._M_dataplus._M_p = (pointer)&local_50.str.field_2;
  local_50.str._M_string_length = 0;
  local_50.str.field_2._M_local_buf[0] = '\0';
  bVar8 = readHeadOfDataObject(this,&local_50);
  if (bVar8) {
    uVar10 = readInt(this);
    this_03 = &mesh->Vertices;
    local_c0 = mesh;
    ::std::vector<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>::resize
              ((vector<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_> *)this_03,
               (ulong)uVar10);
    if (uVar10 != 0) {
      lVar23 = 0;
      do {
        readVector3(this,(vector3df *)
                         ((long)&((this_03->m_data).
                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->Pos + lVar23));
        pSVar18 = (this_03->m_data).
                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pSVar18->Normal + lVar23) = 0;
        *(undefined8 *)((long)&pSVar18->Normal + lVar23 + 8U) = 0xffffffff00000000;
        lVar23 = lVar23 + 0x24;
      } while ((ulong)uVar10 * 0x24 != lVar23);
    }
    bVar8 = checkForTwoFollowingSemicolons(this);
    pSVar27 = local_c0;
    if (!bVar8) {
      os::Printer::log((Printer *)"No finishing semicolon in Mesh Vertex Array found in x file",
                       (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      core::string<char>::string(&local_88,this->Line);
      os::Printer::log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
        operator_delete(local_88.str._M_dataplus._M_p,local_88.str.field_2._M_allocated_capacity + 1
                       );
      }
    }
    uVar10 = readInt(this);
    this_00 = &pSVar27->Indices;
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this_00->m_data,(ulong)(uVar10 * 3));
    this_04 = &pSVar27->IndexCountPerFace;
    ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (&this_04->m_data,(ulong)uVar10);
    uVar30 = 0;
    uVar31 = 0;
    local_88.str._M_dataplus._M_p = (pointer)0x0;
    local_88.str._M_string_length = 0;
    local_88.str.field_2._M_allocated_capacity = 0;
    local_88.str.field_2._M_local_buf[8] = '\x01';
    local_b0 = this;
    if (uVar10 != 0) {
      uVar20 = 0;
      uVar26 = 0;
      do {
        uVar11 = readInt(this);
        if (uVar11 == 3) {
          uVar11 = readInt(this);
          (this_00->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = uVar11;
          uVar11 = readInt(local_b0);
          this = local_b0;
          uVar1 = uVar26 + 2;
          (this_00->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26 + 1] = uVar11;
          uVar11 = readInt(local_b0);
          uVar26 = uVar26 + 3;
          (this_00->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1] = uVar11;
          (this_04->m_data).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar20] = 3;
          bVar8 = true;
          uVar30 = extraout_XMM0_Da_03;
          uVar31 = extraout_XMM0_Db_03;
        }
        else if (uVar11 < 3) {
          os::Printer::log((Printer *)"Invalid face count (<3) found in Mesh x file reader.",
                           (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
          core::string<char>::string(&local_a8,this->Line);
          dVar5 = os::Printer::log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
          uVar30 = SUB84(dVar5,0);
          uVar31 = (undefined4)((ulong)dVar5 >> 0x20);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8.str._M_dataplus._M_p != &local_a8.str.field_2) {
            operator_delete(local_a8.str._M_dataplus._M_p,
                            local_a8.str.field_2._M_allocated_capacity + 1);
            uVar30 = extraout_XMM0_Da_05;
            uVar31 = extraout_XMM0_Db_05;
          }
          this->ErrorState = true;
          bVar8 = false;
        }
        else {
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,(ulong)uVar11)
          ;
          pSVar27 = local_c0;
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (&this_00->m_data,
                     (ulong)(((int)((ulong)((long)(local_c0->Indices).m_data.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(local_c0->Indices).m_data.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 2) +
                             uVar11 * 3) - 9));
          _Var7._M_p = local_88.str._M_dataplus._M_p;
          (pSVar27->IndexCountPerFace).m_data.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start[uVar20] = (short)uVar11 * 3 - 6;
          uVar21 = 0;
          do {
            uVar13 = readInt(this);
            *(u32 *)(_Var7._M_p + uVar21 * 4) = uVar13;
            uVar21 = uVar21 + 1;
          } while (uVar11 != uVar21);
          bVar8 = true;
          this = local_b0;
          uVar30 = extraout_XMM0_Da_06;
          uVar31 = extraout_XMM0_Db_06;
          if (uVar11 - 2 != 0) {
            puVar4 = (this_00->m_data).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar23 = 2;
            do {
              puVar4[uVar26] = *(uint *)local_88.str._M_dataplus._M_p;
              uVar1 = uVar26 + 2;
              puVar4[uVar26 + 1] = *(uint *)(local_88.str._M_dataplus._M_p + lVar23 * 4 + -4);
              uVar26 = uVar26 + 3;
              puVar4[uVar1] = *(uint *)(local_88.str._M_dataplus._M_p + lVar23 * 4);
              lVar2 = lVar23 - (ulong)(uVar11 - 2);
              lVar23 = lVar23 + 1;
            } while (lVar2 != 1);
          }
        }
        if (!bVar8) {
          bVar8 = false;
          goto LAB_001bb714;
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar10);
    }
    pSVar27 = local_c0;
    puVar4 = (local_c0->Indices).m_data.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar12 = (int)((ulong)((long)(local_c0->Indices).m_data.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) >> 2);
    if (iVar12 != 0) {
      lVar23 = 0;
      do {
        if ((uint)((int)((ulong)((long)(local_c0->Vertices).m_data.
                                       super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_c0->Vertices).m_data.
                                      super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39)
            <= puVar4[lVar23]) {
          os::Printer::log((Printer *)"Out of range index found in Mesh x file reader.",
                           (double)CONCAT44(uVar31,uVar30));
          this->ErrorState = true;
          goto LAB_001bb712;
        }
        lVar23 = lVar23 + 1;
      } while (iVar12 != (int)lVar23);
    }
    bVar8 = checkForTwoFollowingSemicolons(this);
    if (!bVar8) {
      os::Printer::log((Printer *)"No finishing semicolon in Mesh Face Array found in x file",
                       (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
      core::string<char>::string(&local_a8,this->Line);
      os::Printer::log((double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.str._M_dataplus._M_p != &local_a8.str.field_2) {
        operator_delete(local_a8.str._M_dataplus._M_p,local_a8.str.field_2._M_allocated_capacity + 1
                       );
      }
    }
    this_01 = &pSVar27->TCoords2;
    do {
      getNextToken(&local_a8,this);
      _Var7._M_p = local_a8.str._M_dataplus._M_p;
      if ((int)local_a8.str._M_string_length == 0) {
        this_02 = "Unexpected ending found in Mesh in x file.";
        uVar30 = extraout_XMM0_Da_09;
        uVar31 = extraout_XMM0_Db_09;
        goto LAB_001bb040;
      }
      iVar12 = strcmp(local_a8.str._M_dataplus._M_p,"}");
      if (iVar12 == 0) {
        iVar12 = 0x18;
      }
      else {
        iVar12 = strcmp(_Var7._M_p,"MeshNormals");
        if (iVar12 == 0) {
          bVar8 = parseDataObjectMeshNormals(this,pSVar27);
LAB_001bb0c8:
          iVar12 = 1;
          if (bVar8 == false) goto LAB_001bb0d3;
        }
        else {
          iVar12 = strcmp(_Var7._M_p,"MeshTextureCoords");
          if (iVar12 == 0) {
            bVar8 = parseDataObjectMeshTextureCoords(this,pSVar27);
            goto LAB_001bb0c8;
          }
          iVar12 = strcmp(_Var7._M_p,"MeshVertexColors");
          if (iVar12 == 0) {
            bVar8 = parseDataObjectMeshVertexColors(this,pSVar27);
            goto LAB_001bb0c8;
          }
          iVar12 = strcmp(_Var7._M_p,"MeshMaterialList");
          if (iVar12 == 0) {
            bVar8 = parseDataObjectMeshMaterialList(this,pSVar27);
            goto LAB_001bb0c8;
          }
          iVar12 = strcmp(_Var7._M_p,"VertexDuplicationIndices");
          if (iVar12 == 0) {
LAB_001bb02c:
            bVar8 = parseUnknownDataObject(this);
            goto LAB_001bb0c8;
          }
          iVar12 = strcmp(_Var7._M_p,"DeclData");
          if (iVar12 != 0) {
            iVar12 = strcmp(_Var7._M_p,"FVFData");
            if (iVar12 != 0) {
              iVar12 = strcmp(_Var7._M_p,"XSkinMeshHeader");
              if (iVar12 == 0) {
                bVar8 = parseDataObjectSkinMeshHeader(this,pSVar27);
              }
              else {
                iVar12 = strcmp(_Var7._M_p,"SkinWeights");
                if (iVar12 != 0) {
                  os::Printer::log((double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
                  goto LAB_001bb02c;
                }
                bVar8 = parseDataObjectSkinWeights(this,pSVar27);
              }
              goto LAB_001bb0c8;
            }
            bVar8 = readHeadOfDataObject(this,(stringc *)0x0);
            if (bVar8) {
              uVar10 = readInt(this);
              uVar11 = readInt(this);
              pvVar16 = (vector2d<float> *)operator_new__((ulong)uVar11 * 4);
              if (uVar11 != 0) {
                uVar20 = 0;
                do {
                  fVar15 = (float)readInt(this);
                  (&pvVar16->X)[uVar20] = fVar15;
                  uVar20 = uVar20 + 1;
                } while (uVar11 != uVar20);
              }
              if (((uVar10 & 0x102) != 0) &&
                 (core::array<irr::core::vector2d<float>_>::reallocate
                            (this_01,(int)((ulong)((long)(pSVar27->Vertices).m_data.
                                                                                                                  
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pSVar27->Vertices).m_data.
                                                                                                                
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                     0x38e38e39,true),
                 (int)((ulong)((long)(pSVar27->Vertices).m_data.
                                     super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pSVar27->Vertices).m_data.
                                    super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39 !=
                 0)) {
                uVar26 = 0;
                element = pvVar16;
                do {
                  core::array<irr::core::vector2d<float>_>::push_back(this_01,element);
                  element = (vector2d<float> *)((long)&element->X + (ulong)(uVar10 >> 5 & 0x78));
                  uVar26 = uVar26 + 1;
                } while (uVar26 < (uint)((int)((ulong)((long)(pSVar27->Vertices).m_data.
                                                                                                                          
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pSVar27->Vertices).m_data.
                                                                                                                
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                        0x38e38e39));
              }
              operator_delete__(pvVar16);
              this = local_b0;
              bVar8 = checkForOneFollowingSemicolons(local_b0);
              if (!bVar8) {
                os::Printer::log((Printer *)"No finishing semicolon in FVFData found.",
                                 (double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14));
                core::string<char>::string(&local_e8,this->Line);
                os::Printer::log((double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8.str._M_dataplus._M_p != &local_e8.str.field_2) {
                  operator_delete(local_e8.str._M_dataplus._M_p,
                                  local_e8.str.field_2._M_allocated_capacity + 1);
                }
              }
              bVar8 = checkForClosingBrace(this);
              if (bVar8) goto LAB_001bb0d1;
              this_02 = "No closing brace in FVFData found in x file";
              uVar30 = extraout_XMM0_Da_16;
              uVar31 = extraout_XMM0_Db_16;
            }
            else {
              this_02 = "No starting brace in FVFData found.";
              uVar30 = extraout_XMM0_Da_13;
              uVar31 = extraout_XMM0_Db_13;
            }
LAB_001bb040:
            os::Printer::log((Printer *)this_02,(double)CONCAT44(uVar31,uVar30));
            core::string<char>::string(&local_e8,this->Line);
            os::Printer::log((double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8.str._M_dataplus._M_p != &local_e8.str.field_2) {
              operator_delete(local_e8.str._M_dataplus._M_p,
                              local_e8.str.field_2._M_allocated_capacity + 1);
            }
            this->ErrorState = true;
            iVar12 = 1;
            goto LAB_001bb0d3;
          }
          bVar8 = readHeadOfDataObject(this,(stringc *)0x0);
          if (!bVar8) {
            this_02 = "No starting brace in DeclData found.";
            uVar30 = extraout_XMM0_Da_12;
            uVar31 = extraout_XMM0_Db_12;
            goto LAB_001bb040;
          }
          uVar10 = readInt(this);
          if (uVar10 == 0) {
            uVar6 = 0xffff;
            local_f0 = 0;
            local_b8 = CONCAT62(local_b8._2_6_,0xffff);
            local_c8 = CONCAT62(local_c8._2_6_,0xffff);
            local_60 = 0;
            local_58 = 0;
            bVar8 = false;
          }
          else {
            local_100 = -1;
            uVar25 = 0;
            local_110 = -1;
            local_f0._0_2_ = -1;
            local_c8 = CONCAT62(local_c8._2_6_,0xffff);
            local_b8 = CONCAT62(local_b8._2_6_,0xffff);
            uVar6 = 0xffff;
            do {
              uVar11 = readInt(this);
              readInt(this);
              uVar13 = readInt(this);
              uVar14 = readInt(this);
              lVar23 = CONCAT44(extraout_var,uVar14);
              sVar28 = (short)uVar11;
              if (uVar13 == 5) {
                if (uVar14 == 1) {
                  local_c8 = CONCAT62(local_c8._2_6_,uVar25);
                  local_100 = sVar28;
                }
                else if (uVar14 == 0) {
                  local_b8 = CONCAT62(local_b8._2_6_,uVar25);
                  local_110 = sVar28;
                }
              }
              else if (uVar13 == 3) {
                local_f0._0_2_ = sVar28;
                uVar6 = uVar25;
              }
              if (uVar11 < 0x11) {
                lVar23 = (long)&switchD_001bb1c5::switchdataD_0022cbe0 +
                         (long)(int)(&switchD_001bb1c5::switchdataD_0022cbe0)[uVar11];
                switch(uVar11) {
                default:
                  uVar25 = uVar25 + 4;
                  break;
                case 1:
                case 7:
                case 10:
                case 0xc:
                case 0x10:
                  uVar25 = uVar25 + 8;
                  break;
                case 2:
                  uVar25 = uVar25 + 0xc;
                  break;
                case 3:
                  uVar25 = uVar25 + 0x10;
                }
              }
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
            bVar8 = local_100 == 1;
            uVar19 = (undefined7)((ulong)lVar23 >> 8);
            local_60 = CONCAT71(uVar19,(short)local_f0 == 2);
            local_58 = CONCAT71(uVar19,local_110 == 1);
            local_f0 = (ulong)uVar25;
            pSVar27 = local_c0;
          }
          uVar10 = readInt(this);
          pvVar17 = operator_new__((ulong)uVar10 * 4);
          if (uVar10 != 0) {
            uVar20 = 0;
            do {
              uVar11 = readInt(this);
              *(u32 *)((long)pvVar17 + uVar20 * 4) = uVar11;
              uVar20 = uVar20 + 1;
            } while (uVar10 != uVar20);
          }
          bVar9 = checkForOneFollowingSemicolons(this);
          paVar3 = &local_e8.str.field_2;
          if (!bVar9) {
            os::Printer::log((Printer *)"No finishing semicolon in DeclData found.",
                             (double)CONCAT44(extraout_XMM0_Db_17,extraout_XMM0_Da_17));
            core::string<char>::string(&local_e8,this->Line);
            os::Printer::log((double)CONCAT44(extraout_XMM0_Db_18,extraout_XMM0_Da_18));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8.str._M_dataplus._M_p != paVar3) {
              operator_delete(local_e8.str._M_dataplus._M_p,
                              local_e8.str.field_2._M_allocated_capacity + 1);
            }
          }
          bVar9 = checkForClosingBrace(this);
          if (bVar9) {
            bVar8 = (bool)((short)local_c8 != -1 & bVar8);
            if (bVar8) {
              core::array<irr::core::vector2d<float>_>::reallocate
                        (this_01,(int)((ulong)((long)(pSVar27->Vertices).m_data.
                                                                                                          
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(pSVar27->Vertices).m_data.
                                                                                                        
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                 0x38e38e39,true);
            }
            pSVar18 = (pSVar27->Vertices).m_data.
                      super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((int)((ulong)((long)(pSVar27->Vertices).m_data.
                                    super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar18) >> 2
                     ) * 0x38e38e39 != 0) {
              bVar24 = uVar6 != 0xffff & (byte)local_60;
              bVar22 = (short)local_b8 != -1 & (byte)local_58;
              local_b8 = (long)(short)local_b8;
              local_c8 = (long)(short)local_c8;
              lVar23 = 0x1c;
              uVar20 = 0;
              pvVar29 = pvVar17;
              do {
                if (bVar24 != 0) {
                  *(undefined8 *)((long)pSVar18 + lVar23 + -0x10) =
                       *(undefined8 *)((long)pvVar29 + (long)(short)uVar6);
                  *(undefined4 *)((long)pSVar18 + lVar23 + -8) =
                       *(undefined4 *)((long)pvVar29 + (long)(short)uVar6 + 8);
                }
                if (bVar22 != 0) {
                  *(undefined8 *)((long)&(pSVar18->Pos).X + lVar23) =
                       *(undefined8 *)((long)pvVar29 + local_b8);
                }
                if (bVar8) {
                  core::array<irr::core::vector2d<float>_>::push_back
                            (this_01,(vector2d<float> *)((long)pvVar29 + local_c8));
                }
                pvVar29 = (void *)((long)pvVar29 + local_f0);
                uVar20 = uVar20 + 1;
                pSVar18 = (local_c0->Vertices).m_data.
                          super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar23 = lVar23 + 0x24;
              } while (uVar20 < (uint)((int)((ulong)((long)(local_c0->Vertices).m_data.
                                                                                                                      
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pSVar18) >> 2) * 0x38e38e39));
            }
            operator_delete__(pvVar17);
            pSVar27 = local_c0;
          }
          else {
            os::Printer::log((Printer *)"No closing brace in DeclData.",
                             (double)CONCAT44(extraout_XMM0_Db_19,extraout_XMM0_Da_19));
            core::string<char>::string(&local_e8,this->Line);
            os::Printer::log((double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8.str._M_dataplus._M_p != paVar3) {
              operator_delete(local_e8.str._M_dataplus._M_p,
                              local_e8.str.field_2._M_allocated_capacity + 1);
            }
            operator_delete__(pvVar17);
            this->ErrorState = true;
          }
          iVar12 = 1;
          if (!bVar9) goto LAB_001bb0d3;
        }
LAB_001bb0d1:
        iVar12 = 0;
      }
LAB_001bb0d3:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.str._M_dataplus._M_p != &local_a8.str.field_2) {
        operator_delete(local_a8.str._M_dataplus._M_p,local_a8.str.field_2._M_allocated_capacity + 1
                       );
      }
    } while (iVar12 == 0);
    if (iVar12 == 0x18) {
      bVar8 = true;
    }
    else {
LAB_001bb712:
      bVar8 = false;
    }
LAB_001bb714:
    if ((uint *)local_88.str._M_dataplus._M_p != (uint *)0x0) {
      operator_delete(local_88.str._M_dataplus._M_p,
                      local_88.str.field_2._M_allocated_capacity -
                      (long)local_88.str._M_dataplus._M_p);
    }
  }
  else {
    os::Printer::log((Printer *)"No opening brace in Mesh found in x file",
                     (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    core::string<char>::string(&local_88,this->Line);
    os::Printer::log((double)CONCAT44(extraout_XMM0_Db_21,extraout_XMM0_Da_21));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
      operator_delete(local_88.str._M_dataplus._M_p,local_88.str.field_2._M_allocated_capacity + 1);
    }
    this->ErrorState = true;
    bVar8 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
    operator_delete(local_50.str._M_dataplus._M_p,
                    CONCAT71(local_50.str.field_2._M_allocated_capacity._1_7_,
                             local_50.str.field_2._M_local_buf[0]) + 1);
  }
  return bVar8;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectMesh(SXMesh &mesh)
{
	core::stringc name;

	if (!readHeadOfDataObject(&name)) {
#ifdef _XREADER_DEBUG
		os::Printer::log("CXFileReader: Reading mesh", ELL_DEBUG);
#endif
		os::Printer::log("No opening brace in Mesh found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: Reading mesh", name.c_str(), ELL_DEBUG);
#endif

	// read vertex count
	const u32 nVertices = readInt();

	// read vertices
	mesh.Vertices.set_used(nVertices);
	for (u32 n = 0; n < nVertices; ++n) {
		readVector3(mesh.Vertices[n].Pos);
		mesh.Vertices[n].Color = 0xFFFFFFFF;
		mesh.Vertices[n].Normal = core::vector3df(0.0f);
	}

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Vertex Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	// read faces
	const u32 nFaces = readInt();

	mesh.Indices.set_used(nFaces * 3);
	mesh.IndexCountPerFace.set_used(nFaces);

	core::array<u32> polygonfaces;
	u32 currentIndex = 0;

	for (u32 k = 0; k < nFaces; ++k) {
		const u32 fcnt = readInt();

		if (fcnt != 3) {
			if (fcnt < 3) {
				os::Printer::log("Invalid face count (<3) found in Mesh x file reader.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}

			// read face indices
			polygonfaces.set_used(fcnt);
			u32 triangles = (fcnt - 2);
			mesh.Indices.set_used(mesh.Indices.size() + ((triangles - 1) * 3));
			mesh.IndexCountPerFace[k] = (u16)(triangles * 3);

			for (u32 f = 0; f < fcnt; ++f)
				polygonfaces[f] = readInt();

			for (u32 jk = 0; jk < triangles; ++jk) {
				mesh.Indices[currentIndex++] = polygonfaces[0];
				mesh.Indices[currentIndex++] = polygonfaces[jk + 1];
				mesh.Indices[currentIndex++] = polygonfaces[jk + 2];
			}

			// TODO: change face indices in material list
		} else {
			mesh.Indices[currentIndex++] = readInt();
			mesh.Indices[currentIndex++] = readInt();
			mesh.Indices[currentIndex++] = readInt();
			mesh.IndexCountPerFace[k] = 3;
		}
	}

	for (u32 j = 0; j < mesh.Indices.size(); j++) {
		if (mesh.Indices[j] >= mesh.Vertices.size()) {
			os::Printer::log("Out of range index found in Mesh x file reader.", ELL_WARNING);
			SET_ERR_AND_RETURN();
		}
	}

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Face Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	// here, other data objects may follow

	while (true) {
		core::stringc objectName = getNextToken();

		if (objectName.size() == 0) {
			os::Printer::log("Unexpected ending found in Mesh in x file.", ELL_WARNING);
			os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			SET_ERR_AND_RETURN();
		} else if (objectName == "}") {
			break; // mesh finished
		}

#ifdef _XREADER_DEBUG
		os::Printer::log("debug DataObject in mesh", objectName.c_str(), ELL_DEBUG);
#endif

		if (objectName == "MeshNormals") {
			if (!parseDataObjectMeshNormals(mesh))
				return false;
		} else if (objectName == "MeshTextureCoords") {
			if (!parseDataObjectMeshTextureCoords(mesh))
				return false;
		} else if (objectName == "MeshVertexColors") {
			if (!parseDataObjectMeshVertexColors(mesh))
				return false;
		} else if (objectName == "MeshMaterialList") {
			if (!parseDataObjectMeshMaterialList(mesh))
				return false;
		} else if (objectName == "VertexDuplicationIndices") {
			// we'll ignore vertex duplication indices
			// TODO: read them
			if (!parseUnknownDataObject())
				return false;
		} else if (objectName == "DeclData") {
			if (!readHeadOfDataObject()) {
				os::Printer::log("No starting brace in DeclData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}
			// arbitrary vertex attributes
			// first comes the number of element definitions
			// then the vertex element type definitions
			// with format type;tesselator;semantics;usageindex
			// we want to support 2;0;6;0 == tangent
			//                    2;0;7;0 == binormal
			//                    2;0;3;0 == normal
			//                  1/2;0;5;0 == 1st uv coord
			// and              1/2;0;5;1 == 2nd uv coord
			// type==2 is 3xf32, type==1 is 2xf32
			u32 j;
			const u32 dcnt = readInt();
			u16 size = 0;
			s16 normalpos = -1;
			s16 uvpos = -1;
			s16 uv2pos = -1;
			s16 tangentpos = -1;
			s16 binormalpos = -1;
			s16 normaltype = -1;
			s16 uvtype = -1;
			s16 uv2type = -1;
			s16 tangenttype = -1;
			s16 binormaltype = -1;

			(void)tangentpos;   // disable unused variable warnings
			(void)binormalpos;  // disable unused variable warnings
			(void)tangenttype;  // disable unused variable warnings
			(void)binormaltype; // disable unused variable warnings

			for (j = 0; j < dcnt; ++j) {
				const u32 type = readInt();
				// const u32 tesselator = readInt();
				readInt();
				const u32 semantics = readInt();
				const u32 index = readInt();
				switch (semantics) {
				case 3:
					normalpos = size;
					normaltype = type;
					break;
				case 5:
					if (index == 0) {
						uvpos = size;
						uvtype = type;
					} else if (index == 1) {
						uv2pos = size;
						uv2type = type;
					}
					break;
				case 6:
					tangentpos = size;
					tangenttype = type;
					break;
				case 7:
					binormalpos = size;
					binormaltype = type;
					break;
				default:
					break;
				}
				switch (type) {
				case 0:
					size += 4;
					break;
				case 1:
					size += 8;
					break;
				case 2:
					size += 12;
					break;
				case 3:
					size += 16;
					break;
				case 4:
				case 5:
				case 6:
					size += 4;
					break;
				case 7:
					size += 8;
					break;
				case 8:
				case 9:
					size += 4;
					break;
				case 10:
					size += 8;
					break;
				case 11:
					size += 4;
					break;
				case 12:
					size += 8;
					break;
				case 13:
					size += 4;
					break;
				case 14:
					size += 4;
					break;
				case 15:
					size += 4;
					break;
				case 16:
					size += 8;
					break;
				}
			}
			const u32 datasize = readInt();
			u32 *data = new u32[datasize];
			for (j = 0; j < datasize; ++j)
				data[j] = readInt();

			if (!checkForOneFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon in DeclData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}
			if (!checkForClosingBrace()) {
				os::Printer::log("No closing brace in DeclData.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				delete[] data;
				SET_ERR_AND_RETURN();
			}
			u8 *dataptr = (u8 *)data;
			if ((uv2pos != -1) && (uv2type == 1))
				mesh.TCoords2.reallocate(mesh.Vertices.size());
			for (j = 0; j < mesh.Vertices.size(); ++j) {
				if ((normalpos != -1) && (normaltype == 2))
					mesh.Vertices[j].Normal.set(*((core::vector3df *)(dataptr + normalpos)));
				if ((uvpos != -1) && (uvtype == 1))
					mesh.Vertices[j].TCoords.set(*((core::vector2df *)(dataptr + uvpos)));
				if ((uv2pos != -1) && (uv2type == 1))
					mesh.TCoords2.push_back(*((core::vector2df *)(dataptr + uv2pos)));
				dataptr += size;
			}
			delete[] data;
		} else if (objectName == "FVFData") {
			if (!readHeadOfDataObject()) {
				os::Printer::log("No starting brace in FVFData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}
			const u32 dataformat = readInt();
			const u32 datasize = readInt();
			u32 *data = new u32[datasize];
			for (u32 j = 0; j < datasize; ++j)
				data[j] = readInt();
			if (dataformat & 0x102) { // 2nd uv set
				mesh.TCoords2.reallocate(mesh.Vertices.size());
				u8 *dataptr = (u8 *)data;
				const u32 size = ((dataformat >> 8) & 0xf) * sizeof(core::vector2df);
				for (u32 j = 0; j < mesh.Vertices.size(); ++j) {
					mesh.TCoords2.push_back(*((core::vector2df *)(dataptr)));
					dataptr += size;
				}
			}
			delete[] data;
			if (!checkForOneFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon in FVFData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}
			if (!checkForClosingBrace()) {
				os::Printer::log("No closing brace in FVFData found in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}
		} else if (objectName == "XSkinMeshHeader") {
			if (!parseDataObjectSkinMeshHeader(mesh))
				return false;
		} else if (objectName == "SkinWeights") {
			// mesh.SkinWeights.push_back(SXSkinWeight());
			// if (!parseDataObjectSkinWeights(mesh.SkinWeights.getLast()))
			if (!parseDataObjectSkinWeights(mesh))
				return false;
		} else {
			os::Printer::log("Unknown data object in mesh in x file", objectName.c_str(), ELL_WARNING);
			if (!parseUnknownDataObject())
				return false;
		}
	}

	return true;
}